

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::compiler::Version::_InternalSerialize
          (Version *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint8_t *puVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint8_t *ptr;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    puVar4 = target;
    if (stream->end_ <= target) {
      puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar2 = this->major_;
    *puVar4 = '\b';
    puVar4[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      target = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar4[2] = (uint8_t)uVar6;
      target = puVar4 + 3;
      if (0x3fff < uVar2) {
        uVar8 = (ulong)puVar4[2];
        do {
          target[-1] = (byte)uVar8 | 0x80;
          uVar7 = uVar6 >> 7;
          *target = (uint8_t)uVar7;
          target = target + 1;
          uVar8 = uVar7 & 0xffffffff;
          bVar3 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar3);
      }
    }
  }
  puVar4 = target;
  if ((uVar1 & 4) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar2 = this->minor_;
    *target = '\x10';
    target[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      target[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      target[2] = (uint8_t)uVar6;
      puVar4 = target + 3;
      if (0x3fff < uVar2) {
        uVar8 = (ulong)target[2];
        do {
          puVar4[-1] = (byte)uVar8 | 0x80;
          uVar7 = uVar6 >> 7;
          *puVar4 = (uint8_t)uVar7;
          puVar4 = puVar4 + 1;
          uVar8 = uVar7 & 0xffffffff;
          bVar3 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar3);
      }
    }
  }
  ptr = puVar4;
  if ((uVar1 & 8) != 0) {
    if (stream->end_ <= puVar4) {
      puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar4);
    }
    uVar2 = this->patch_;
    *puVar4 = '\x18';
    puVar4[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      ptr = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar4[2] = (uint8_t)uVar6;
      ptr = puVar4 + 3;
      if (0x3fff < uVar2) {
        uVar8 = (ulong)puVar4[2];
        do {
          ptr[-1] = (byte)uVar8 | 0x80;
          uVar7 = uVar6 >> 7;
          *ptr = (uint8_t)uVar7;
          ptr = ptr + 1;
          uVar8 = uVar7 & 0xffffffff;
          bVar3 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar3);
      }
    }
  }
  if ((uVar1 & 1) != 0) {
    puVar5 = (undefined8 *)((ulong)(this->suffix_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar5,*(int *)(puVar5 + 1),SERIALIZE,
               "google.protobuf.compiler.Version.suffix");
    ptr = io::EpsCopyOutputStream::WriteStringMaybeAliased
                    (stream,4,(string *)
                              ((ulong)(this->suffix_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),ptr);
  }
  uVar6 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar6 & 0xfffffffffffffffc) + 8),ptr,stream);
    return puVar4;
  }
  return ptr;
}

Assistant:

uint8_t* Version::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.Version)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 major = 1;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(1, this->_internal_major(), target);
  }

  // optional int32 minor = 2;
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_minor(), target);
  }

  // optional int32 patch = 3;
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_patch(), target);
  }

  // optional string suffix = 4;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_suffix().data(), static_cast<int>(this->_internal_suffix().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.Version.suffix");
    target = stream->WriteStringMaybeAliased(
        4, this->_internal_suffix(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.Version)
  return target;
}